

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::increaseIntensity_repair_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int beam,double intensity,int ratio)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  uint uVar4;
  pair<int,_int> pVar5;
  ulong uVar6;
  int j;
  ulong uVar7;
  long lVar8;
  int j_1;
  long lVar9;
  int i;
  long lVar10;
  double dVar11;
  
  increaseIntensity_abi_cxx11_(__return_storage_ptr__,this,beam,intensity,ratio);
  pVar5 = getPos(this,beam);
  if (intensity <= 0.0) {
    for (lVar10 = 0; iVar3 = Collimator::getXdim(this->collimator), lVar10 < iVar3;
        lVar10 = lVar10 + 1) {
      iVar3 = Collimator::getYdim(this->collimator);
      if (pVar5.second < iVar3 / 2) {
        uVar4 = Collimator::getYdim(this->collimator);
        uVar6 = 0;
        dVar11 = -1.0;
        while (0 < (int)uVar4) {
          uVar4 = uVar4 - 1;
          dVar1 = (this->I).p[lVar10][uVar4];
          if (dVar11 < dVar1) {
            uVar6 = (ulong)uVar4;
            dVar11 = dVar1;
          }
        }
      }
      else {
        uVar6 = 0;
        dVar11 = -1.0;
        for (uVar7 = 0; iVar3 = Collimator::getYdim(this->collimator), (long)uVar7 < (long)iVar3;
            uVar7 = uVar7 + 1) {
          dVar1 = (this->I).p[lVar10][uVar7];
          if (dVar11 < dVar1) {
            uVar6 = uVar7 & 0xffffffff;
            dVar11 = dVar1;
          }
        }
      }
      lVar8 = (long)(int)uVar6;
      while( true ) {
        lVar9 = lVar8 + 1;
        iVar3 = Collimator::getYdim(this->collimator);
        if (iVar3 <= lVar9) break;
        pdVar2 = (this->I).p[lVar10];
        dVar11 = pdVar2[lVar8];
        lVar8 = lVar9;
        if (dVar11 < pdVar2[lVar9]) {
          change_intensity(this,(int)lVar10,(int)lVar9,dVar11,__return_storage_ptr__);
        }
      }
      while (0 < (int)uVar6) {
        uVar7 = uVar6 - 1;
        pdVar2 = (this->I).p[lVar10];
        dVar11 = pdVar2[uVar6];
        uVar6 = uVar7;
        if (dVar11 < pdVar2[uVar7 & 0xffffffff]) {
          change_intensity(this,(int)lVar10,(int)uVar7,dVar11,__return_storage_ptr__);
        }
      }
    }
  }
  else {
    for (lVar10 = 0; iVar3 = Collimator::getXdim(this->collimator), lVar10 < iVar3;
        lVar10 = lVar10 + 1) {
      uVar6 = 0;
      dVar11 = -1.0;
      for (uVar7 = 0; iVar3 = Collimator::getYdim(this->collimator), (long)uVar7 < (long)iVar3;
          uVar7 = uVar7 + 1) {
        dVar1 = (this->I).p[lVar10][uVar7];
        if (dVar11 < dVar1) {
          uVar6 = uVar7 & 0xffffffff;
          dVar11 = dVar1;
        }
      }
      for (lVar8 = 1; lVar8 < (int)uVar6; lVar8 = lVar8 + 1) {
        pdVar2 = (this->I).p[lVar10];
        dVar11 = pdVar2[lVar8 + -1];
        pdVar2 = pdVar2 + lVar8;
        if (*pdVar2 <= dVar11 && dVar11 != *pdVar2) {
          change_intensity(this,(int)lVar10,(int)lVar8,dVar11,__return_storage_ptr__);
        }
      }
      iVar3 = Collimator::getYdim(this->collimator);
      for (lVar8 = (long)(iVar3 + -2); (int)uVar6 < lVar8; lVar8 = lVar8 + -1) {
        pdVar2 = (this->I).p[lVar10];
        dVar11 = pdVar2[lVar8 + 1];
        pdVar2 = pdVar2 + lVar8;
        if (*pdVar2 <= dVar11 && dVar11 != *pdVar2) {
          change_intensity(this,(int)lVar10,(int)lVar8,dVar11,__return_storage_ptr__);
        }
      }
    }
  }
  while ((ulong)(long)this->max_apertures <
         (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    reduce_apertures(this,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

list< pair< int, double > > Station::increaseIntensity_repair(int beam, double intensity, int ratio){
    list< pair< int, double > > diff=increaseIntensity(beam, intensity, ratio);

    pair<int,int> p = getPos(beam);
    int x=p.first, y=p.second;

    if(intensity > 0.0) //reparation (phase 1A)

    for(int i=0; i<collimator.getXdim(); i++){
      int max_j=0; double max_value=-1;
      for(int j=0; j<collimator.getYdim(); j++)
         if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}

      for(int j=1; j<max_j; j++)
        if(I(i,j) < I(i,j-1))
            change_intensity(i, j, I(i,j-1), &diff);

      for(int j=collimator.getYdim()-2; j>max_j; j--)
        if(I(i,j) < I(i,j+1))
             change_intensity(i, j, I(i,j+1), &diff);
    }

    else //reparation (phase 1B)

    for(int i=0; i<collimator.getXdim(); i++){
      int max_j=0; double max_value=-1;

      if(y<collimator.getYdim()/2){
        for(int j=collimator.getYdim()-1; j>=0; j--)
          if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}
      }else{
        for(int j=0; j<collimator.getYdim(); j++)
          if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}
      }

      for(int j=max_j+1; j<collimator.getYdim(); j++)
        if(I(i,j) > I(i,j-1))
             change_intensity(i, j, I(i,j-1), &diff);

      for(int j=max_j-1; j>=0; j--)
        if(I(i,j) > I(i,j+1))
              change_intensity(i, j, I(i,j+1), &diff);
    }

    //reparation (phase 2)
    while(int2nb.size()>max_apertures)
    	reduce_apertures(diff);


    return diff;
  }